

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZone::getOffset
          (TimeZone *this,UDate date,UBool local,int32_t *rawOffset,int32_t *dstOffset,
          UErrorCode *ec)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int8_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double day;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  TimeZone *local_50;
  int *local_48;
  int *local_40;
  UErrorCode *local_38;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    local_50 = this;
    local_48 = rawOffset;
    local_40 = dstOffset;
    local_38 = ec;
    iVar6 = (*(this->super_UObject)._vptr_UObject[8])();
    *local_48 = iVar6;
    if (local == '\0') {
      date = date + (double)iVar6;
    }
    bVar9 = true;
    while( true ) {
      day = uprv_floor_63(date / 86400000.0);
      Grego::dayToFields(day,&year,&month,&dom,&dow);
      iVar4 = year;
      iVar3 = month;
      iVar2 = dom;
      bVar1 = (byte)dow;
      iVar5 = Grego::monthLength(year,month);
      iVar7 = (*(local_50->super_UObject)._vptr_UObject[5])
                        (local_50,1,(ulong)(uint)iVar4,(ulong)(uint)iVar3,(ulong)(uint)iVar2,
                         (ulong)bVar1,(ulong)(uint)(int)(date - day * 86400000.0),
                         (ulong)(uint)(int)iVar5,local_38);
      iVar6 = *local_48;
      iVar8 = iVar7 - iVar6;
      *local_40 = iVar8;
      if (((local == '\0') || (!bVar9)) || (iVar7 == iVar6)) break;
      date = date - (double)iVar8;
      bVar9 = false;
    }
  }
  return;
}

Assistant:

void TimeZone::getOffset(UDate date, UBool local, int32_t& rawOffset,
                         int32_t& dstOffset, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return;
    }

    rawOffset = getRawOffset();
    if (!local) {
        date += rawOffset; // now in local standard millis
    }

    // When local == TRUE, date might not be in local standard
    // millis.  getOffset taking 7 parameters used here assume
    // the given time in day is local standard time.
    // At STD->DST transition, there is a range of time which
    // does not exist.  When 'date' is in this time range
    // (and local == TRUE), this method interprets the specified
    // local time as DST.  At DST->STD transition, there is a
    // range of time which occurs twice.  In this case, this
    // method interprets the specified local time as STD.
    // To support the behavior above, we need to call getOffset
    // (with 7 args) twice when local == true and DST is
    // detected in the initial call.
    for (int32_t pass=0; ; ++pass) {
        int32_t year, month, dom, dow;
        double day = uprv_floor(date / U_MILLIS_PER_DAY);
        int32_t millis = (int32_t) (date - day * U_MILLIS_PER_DAY);

        Grego::dayToFields(day, year, month, dom, dow);

        dstOffset = getOffset(GregorianCalendar::AD, year, month, dom,
                              (uint8_t) dow, millis,
                              Grego::monthLength(year, month),
                              ec) - rawOffset;

        // Recompute if local==TRUE, dstOffset!=0.
        if (pass!=0 || !local || dstOffset == 0) {
            break;
        }
        // adjust to local standard millis
        date -= dstOffset;
    }
}